

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O0

REF_STATUS ref_shard_mark_to_split(REF_SHARD ref_shard,REF_INT node0,REF_INT node1)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT face;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_SHARD ref_shard_local;
  
  ref_private_macro_code_rss = node1;
  face = node0;
  _node1_local = ref_shard;
  uVar1 = ref_face_spanning(ref_shard->face,node0,node1,&ref_private_macro_code_rss_1);
  if (uVar1 == 0) {
    if ((face == _node1_local->face->f2n[ref_private_macro_code_rss_1 * 4 + 2]) ||
       (ref_private_macro_code_rss == _node1_local->face->f2n[ref_private_macro_code_rss_1 * 4 + 2])
       ) {
      if (_node1_local->mark[ref_private_macro_code_rss_1] == 3) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x49,"ref_shard_mark_to_split",1,"2-3 mark mismatch");
        ref_shard_local._4_4_ = 1;
      }
      else {
        _node1_local->mark[ref_private_macro_code_rss_1] = 2;
        ref_shard_local._4_4_ = 0;
      }
    }
    else if ((face == _node1_local->face->f2n[ref_private_macro_code_rss_1 * 4 + 3]) ||
            (ref_private_macro_code_rss ==
             _node1_local->face->f2n[ref_private_macro_code_rss_1 * 4 + 3])) {
      if (_node1_local->mark[ref_private_macro_code_rss_1] == 2) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x51,"ref_shard_mark_to_split",1,"3-2 mark mismatch");
        ref_shard_local._4_4_ = 1;
      }
      else {
        _node1_local->mark[ref_private_macro_code_rss_1] = 3;
        ref_shard_local._4_4_ = 0;
      }
    }
    else {
      ref_shard_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x44,
           "ref_shard_mark_to_split",(ulong)uVar1,"missing face");
    ref_shard_local._4_4_ = uVar1;
  }
  return ref_shard_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_shard_mark_to_split(REF_SHARD ref_shard, REF_INT node0,
                                           REF_INT node1) {
  REF_INT face;

  RSS(ref_face_spanning(ref_shard_face(ref_shard), node0, node1, &face),
      "missing face");

  if (node0 == ref_face_f2n(ref_shard_face(ref_shard), 2, face) ||
      node1 == ref_face_f2n(ref_shard_face(ref_shard), 2, face)) {
    if (3 == ref_shard_mark(ref_shard, face))
      RSS(REF_FAILURE, "2-3 mark mismatch");
    ref_shard_mark(ref_shard, face) = 2;
    return REF_SUCCESS;
  }

  if (node0 == ref_face_f2n(ref_shard_face(ref_shard), 3, face) ||
      node1 == ref_face_f2n(ref_shard_face(ref_shard), 3, face)) {
    if (2 == ref_shard_mark(ref_shard, face))
      RSS(REF_FAILURE, "3-2 mark mismatch");
    ref_shard_mark(ref_shard, face) = 3;
    return REF_SUCCESS;
  }

  return REF_FAILURE;
}